

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status google::protobuf::json_internal::JsonToBinaryStream
                 (TypeResolver *resolver,string *type_url,ZeroCopyInputStream *json_input,
                 ZeroCopyOutputStream *binary_output,ParseOptions options)

{
  bool bVar1;
  undefined8 uVar2;
  ZeroCopyOutputStream *stream;
  initializer_list<google::protobuf::json_internal::MessagePath::Component> __l;
  string_view url;
  Status s;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> desc;
  MessagePath path;
  optional<google::protobuf::io::StringOutputStream> tee_output;
  string out;
  string copy;
  optional<google::protobuf::io::ArrayInputStream> tee_input;
  ResolverPool pool;
  Msg<ParseProto3Type> msg;
  _func_int **local_248;
  _func_int **local_240;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_238;
  Desc<google::protobuf::json_internal::ParseProto3Type> *local_230;
  HeapOrSoo local_228;
  long local_218;
  ZeroCopyOutputStream local_210 [2];
  char local_200;
  TypeResolver *local_1f8;
  undefined8 local_1f0;
  TypeResolver local_1e8 [2];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  JsonLexer local_1b8;
  ZeroCopyInputStream local_130 [4];
  char local_110;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  string *local_c8;
  undefined1 local_c0 [24];
  size_t local_a8;
  char *local_a0;
  int32_t local_98;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_70;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_50;
  
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = 0;
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0]._vptr_TypeResolver._0_1_ = 0;
  local_110 = '\0';
  local_200 = '\0';
  local_248 = (_func_int **)0x1;
  local_c0._16_8_ = json_input->_vptr_ZeroCopyInputStream;
  local_c0._8_8_ = json_input[1]._vptr_ZeroCopyInputStream;
  local_c0._0_4_ = TYPE_MESSAGE;
  local_a8 = 0;
  local_a0 = "";
  local_98 = -1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_c0;
  std::
  vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
  ::vector((vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
            *)&local_228.heap,__l,(allocator_type *)&local_1b8);
  local_1b8.stream_.stream_ = (ZeroCopyInputStream *)binary_output;
  if (local_110 != '\0') {
    local_1b8.stream_.stream_ = local_130;
  }
  local_1b8.stream_.outstanding_buffer_borrows_ = 0;
  local_1b8.stream_.last_chunk_._M_len = 0;
  local_1b8.stream_.last_chunk_._M_str = (char *)0x0;
  local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_1b8.stream_.using_buf_ = false;
  local_1b8.stream_.cursor_ = 0;
  local_1b8.stream_.buffer_start_ = 0;
  local_1b8.stream_.eof_ = false;
  local_1b8.json_loc_.col = 0;
  local_1b8.json_loc_.offset = 0;
  local_1b8.json_loc_.line = 0;
  stream = options._0_8_;
  if (local_200 != '\0') {
    stream = local_210;
  }
  local_1b8.json_loc_.path = (MessagePath *)&local_228;
  local_1b8.path_ = (MessagePath *)&local_228;
  ParseProto3Type::Msg::Msg((Msg *)local_c0,stream);
  local_108._0_8_ = 0;
  local_108._8_8_ = 0;
  local_108._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  url._M_str = (char *)json_input[1]._vptr_ZeroCopyInputStream;
  url._M_len = (size_t)local_108;
  local_c8 = type_url;
  ResolverPool::FindMessage((ResolverPool *)&local_238.status_,url);
  resolver->_vptr_TypeResolver = (_func_int **)local_238;
  if (((ulong)local_238 & 1) == 0) {
    LOCK();
    *(int *)local_238 = *(int *)local_238 + 1;
    UNLOCK();
  }
  if (resolver->_vptr_TypeResolver == (_func_int **)0x1) {
    if (local_238 !=
        (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
         )0x1) {
      uVar2 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_238.status_);
      __clang_call_terminate(uVar2);
    }
    anon_unknown_5::ParseMessage<google::protobuf::json_internal::ParseProto3Type>
              ((anon_unknown_5 *)&local_240,&local_1b8,local_230,
               (Msg<google::protobuf::json_internal::ParseProto3Type> *)local_c0,false);
    if (local_240 != (_func_int **)0x1) {
      local_248 = local_240;
      local_240 = (_func_int **)0x37;
    }
    if (((ulong)local_240 & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
    if ((local_248 == (_func_int **)0x1) && (bVar1 = JsonLexer::AtEof(&local_1b8), !bVar1)) {
      absl::lts_20240722::InvalidArgumentError
                (&local_240,0x2e,"extraneous characters after end of JSON object");
      if (local_240 != (_func_int **)0x1) {
        local_248 = local_240;
        local_240 = (_func_int **)0x37;
      }
      if (((ulong)local_240 & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
      }
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
              ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
               &local_238.status_);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
                     *)local_e8);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                     *)local_108);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::~raw_hash_set(&local_50);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::~raw_hash_set(&local_70);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_c0);
    if (local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      CONCAT71(local_1b8.stream_.buf_.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               local_1b8.stream_.buf_.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_228.heap.control != (ctrl_t *)0x0) {
      operator_delete(local_228.heap.control,local_218 - local_228._0_8_);
    }
    resolver->_vptr_TypeResolver = local_248;
    local_248 = (_func_int **)0x37;
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
              ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
               &local_238.status_);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
                     *)local_e8);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                     *)local_108);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::~raw_hash_set(&local_50);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::~raw_hash_set(&local_70);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_c0);
    if (local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      CONCAT71(local_1b8.stream_.buf_.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._1_7_,
                               local_1b8.stream_.buf_.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_) -
                      (long)local_1b8.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_228.heap.control != (ctrl_t *)0x0) {
      operator_delete(local_228.heap.control,local_218 - local_228._0_8_);
    }
  }
  if (((ulong)local_248 & 1) == 0) {
    absl::lts_20240722::status_internal::StatusRep::Unref();
  }
  if (local_200 == '\x01') {
    local_200 = '\0';
  }
  if (local_110 == '\x01') {
    local_110 = '\0';
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,
                    CONCAT71(local_1e8[0]._vptr_TypeResolver._1_7_,
                             local_1e8[0]._vptr_TypeResolver._0_1_) + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return (Status)(uintptr_t)resolver;
}

Assistant:

absl::Status JsonToBinaryStream(google::protobuf::util::TypeResolver* resolver,
                                const std::string& type_url,
                                io::ZeroCopyInputStream* json_input,
                                io::ZeroCopyOutputStream* binary_output,
                                json_internal::ParseOptions options) {
  // NOTE: Most of the contortions in this function are to allow for capture of
  // input and output of the parser in ABSL_DLOG mode. Destruction order is very
  // critical in this function, because io::ZeroCopy*Stream types usually only
  // flush on destruction.

  // For ABSL_DLOG, we would like to print out the input and output, which
  // requires buffering both instead of doing "zero copy". This block, and the
  // one at the end of the function, set up and tear down interception of the
  // input and output streams.
  std::string copy;
  std::string out;
  absl::optional<io::ArrayInputStream> tee_input;
  absl::optional<io::StringOutputStream> tee_output;
  if (PROTOBUF_DEBUG) {
    const void* data;
    int len;
    while (json_input->Next(&data, &len)) {
      copy.resize(copy.size() + len);
      std::memcpy(&copy[copy.size() - len], data, len);
    }
    tee_input.emplace(copy.data(), copy.size());
    tee_output.emplace(&out);
    ABSL_DLOG(INFO) << "json2/input: " << absl::CHexEscape(copy);
  }

  // This scope forces the CodedOutputStream inside of `msg` to flush before we
  // possibly handle logging the binary protobuf output.
  absl::Status s;
  {
    MessagePath path(type_url);
    JsonLexer lex(tee_input.has_value() ? &*tee_input : json_input, options,
                  &path);
    Msg<ParseProto3Type> msg(tee_output.has_value() ? &*tee_output
                                                    : binary_output);

    ResolverPool pool(resolver);
    auto desc = pool.FindMessage(type_url);
    RETURN_IF_ERROR(desc.status());

    s = ParseMessage<ParseProto3Type>(lex, **desc, msg, /*any_reparse=*/false);
    if (s.ok() && !lex.AtEof()) {
      s = absl::InvalidArgumentError(
          "extraneous characters after end of JSON object");
    }
  }

  if (PROTOBUF_DEBUG) {
    tee_output.reset();  // Flush the output stream.
    io::zc_sink_internal::ZeroCopyStreamByteSink(binary_output)
        .Append(out.data(), out.size());
    ABSL_DLOG(INFO) << "json2/status: " << s;
    ABSL_DLOG(INFO) << "json2/output: " << absl::BytesToHexString(out);
  }

  return s;
}